

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FloatImage.cpp
# Opt level: O0

void __thiscall
nv::FloatImage::scaleBias(FloatImage *this,uint base_component,uint num,float scale,float bias)

{
  ushort uVar1;
  ushort uVar2;
  float *pfVar3;
  uint local_34;
  uint i;
  float *ptr;
  uint c;
  uint size;
  float bias_local;
  float scale_local;
  uint num_local;
  uint base_component_local;
  FloatImage *this_local;
  
  uVar1 = this->m_width;
  uVar2 = this->m_height;
  for (ptr._0_4_ = 0; (uint)ptr < num; ptr._0_4_ = (uint)ptr + 1) {
    pfVar3 = channel(this,base_component + (uint)ptr);
    for (local_34 = 0; local_34 < (uint)uVar1 * (uint)uVar2; local_34 = local_34 + 1) {
      pfVar3[local_34] = scale * (pfVar3[local_34] + bias);
    }
  }
  return;
}

Assistant:

void FloatImage::scaleBias(uint base_component, uint num, float scale, float bias)
{
	const uint size = m_width * m_height;
	
	for(uint c = 0; c < num; c++) {
		float * ptr = this->channel(base_component + c);
		
		for(uint i = 0; i < size; i++) {
			ptr[i] = scale * (ptr[i] + bias);
		}
	}
}